

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O1

RatiotestResult ratiotest(Runtime *runtime,QpVector *p,QpVector *rowmove,double alphastart)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  RatiotestResult RVar17;
  RatiotestResult RVar18;
  
  if ((runtime->settings).ratiotest != Textbook) {
    RVar17 = ratiotest_textbook(runtime,p,rowmove,&runtime->relaxed_for_ratiotest,alphastart);
    dVar15 = RVar17.alpha;
    uVar8 = RVar17._8_8_ >> 0x20;
    iVar5 = RVar17.limitingconstraint;
    if (iVar5 == -1) {
      uVar11 = 0xffffffff;
    }
    else {
      uVar4 = (runtime->instance).num_con;
      if (iVar5 < (int)uVar4) {
        pdVar9 = (rowmove->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
      }
      else {
        pdVar9 = (p->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)(iVar5 - uVar4);
      }
      dVar13 = *pdVar9;
      if (0 < (int)uVar4) {
        dVar14 = (runtime->settings).ratiotest_t;
        uVar11 = 0;
        do {
          dVar1 = (runtime->rowactivity).value.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar11];
          dVar2 = (rowmove->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11];
          dVar3 = (runtime->instance).con_up.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar11];
          if ((-dVar14 <= dVar2) ||
             (dVar16 = (runtime->instance).con_lo.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11], dVar16 == -INFINITY)) {
            dVar16 = INFINITY;
            if ((dVar14 < dVar2) && (dVar16 = INFINITY, dVar3 != INFINITY)) {
              dVar16 = (dVar3 - dVar1) / dVar2;
            }
          }
          else {
            dVar16 = (dVar16 - dVar1) / dVar2;
          }
          if ((ABS(dVar13) <= ABS(dVar2)) && (dVar16 <= dVar15)) {
            uVar8 = (ulong)(dVar2 < 0.0);
            uVar7 = uVar11 & 0xffffffff;
            RVar17.limitingconstraint = (int)uVar7;
            RVar17.nowactiveatlower = (bool)(char)(uVar7 >> 0x20);
            RVar17._13_3_ = (int3)(uVar7 >> 0x28);
            RVar17.alpha = dVar16;
            dVar13 = dVar2;
          }
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
      dVar14 = RVar17.alpha;
      uVar6 = RVar17.limitingconstraint;
      lVar10 = (long)(runtime->instance).num_var;
      if (0 < lVar10) {
        dVar1 = (runtime->settings).ratiotest_t;
        lVar12 = 0;
        do {
          dVar14 = (runtime->primal).value.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar12];
          dVar2 = (p->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12];
          dVar3 = (runtime->instance).var_up.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar12];
          if ((-dVar1 <= dVar2) ||
             (dVar16 = (runtime->instance).var_lo.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12], dVar16 == -INFINITY)) {
            dVar16 = INFINITY;
            if ((dVar1 < dVar2) && (dVar16 = INFINITY, dVar3 != INFINITY)) {
              dVar16 = (dVar3 - dVar14) / dVar2;
            }
          }
          else {
            dVar16 = (dVar16 - dVar14) / dVar2;
          }
          if ((ABS(dVar13) <= ABS(dVar2)) && (dVar16 <= dVar15)) {
            uVar8 = (ulong)(dVar2 < 0.0);
            RVar17.limitingconstraint = uVar4 + (int)lVar12;
            RVar17.alpha = dVar16;
            RVar17._12_4_ = 0;
            dVar13 = dVar2;
          }
          dVar14 = RVar17.alpha;
          uVar6 = RVar17.limitingconstraint;
          lVar12 = lVar12 + 1;
        } while (lVar10 != lVar12);
      }
      dVar15 = dVar14;
      if (dVar14 <= 0.0) {
        dVar15 = 0.0;
      }
      uVar11 = (ulong)uVar6;
    }
    RVar18._8_8_ = (uVar8 & 0xff) << 0x20 | uVar11;
    RVar18.alpha = dVar15;
    return RVar18;
  }
  RVar17 = ratiotest_textbook(runtime,p,rowmove,&runtime->instance,alphastart);
  return RVar17;
}

Assistant:

RatiotestResult ratiotest(Runtime& runtime, const QpVector& p,
                          const QpVector& rowmove, double alphastart) {
  switch (runtime.settings.ratiotest) {
    case RatiotestStrategy::Textbook:
      return ratiotest_textbook(runtime, p, rowmove, runtime.instance,
                                alphastart);
    case RatiotestStrategy::TwoPass:
    default:  // to fix -Wreturn-type warning
      return ratiotest_twopass(runtime, p, rowmove,
                               runtime.relaxed_for_ratiotest, alphastart);
  }
}